

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void do_pswitch(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  char *pcVar2;
  char name [4608];
  char local_1218 [4616];
  
  pcVar2 = one_argument(argument,local_1218);
  iVar1 = get_trust(ch);
  if (iVar1 < 0x3c) {
    pcVar2 = "Huh?\n\r";
  }
  else {
    if ((local_1218[0] != '\0') && (*pcVar2 != '\0')) {
      return;
    }
    pcVar2 = "Syntax: pswitch <char> to load a player and switch into them\n\rpswitch end to return"
    ;
  }
  send_to_char(pcVar2,ch);
  return;
}

Assistant:

void do_pswitch(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char name[MAX_STRING_LENGTH];
	char buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	argument = one_argument(argument, name);
	if (get_trust(ch) < MAX_LEVEL)
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (name[0] == '\0' || argument[0] == '\0')
	{
		send_to_char("Syntax: pswitch <char> to load a player and switch into them\n\rpswitch end to return", ch);
		return;
	}

	name[0] = UPPER(name[0]);
	return;

	if (get_char_world(ch, name) != nullptr)
	{
		send_to_char("That character is already online!\n\r", ch);
		return;
	}

	d = new_descriptor();

	if (!load_char_obj(d, name))
	{
		send_to_char("No such character exists.\n\r", ch);
		return;
	}

	sprintf(buf, "cp %s/%s%s %s/pload.txt", RIFT_PLAYER_DIR, name, ".plr", RIFT_PLAYER_DIR);

	auto returnCode = system(buf);
	if(returnCode != 0) // cp returns 0 on SUCCESS, 1 on ERROR. system returns -1 on ERROR
		RS.Logger.Warn("Command [{}] failed with exit code [{}]", buf, returnCode);

	d->character->desc = nullptr;
	d->character->next = char_list;
	char_list = d->character;
	d->outsize = 2000;
	d->outbuf = new char[d->outsize];
	d->connected = CON_PLAYING;
	reset_char(d->character);

	victim = d->character;
	d->character->pcdata->host = palloc_string("PLOAD");
}